

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,char *settingsFileName,char *fallbackSettingsFileName)

{
  auto_ptr<cmMakefile> aVar1;
  bool bVar2;
  cmMakefile *this_00;
  ostream *poVar3;
  char *pcVar4;
  pointer pbVar5;
  auto_ptr<cmMakefile> mf;
  string ignoreTargetsRegexes;
  RegularExpression currentRegex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  string currentRegexString;
  cmake cm;
  cmGlobalGenerator ggi;
  auto_ptr<cmMakefile> local_958;
  string local_950;
  cmLocalGenerator *local_930;
  undefined1 local_928 [184];
  char *local_870;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_858;
  char *local_838 [4];
  cmake local_818;
  undefined1 local_568 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558 [82];
  
  cmake::cmake(&local_818);
  std::__cxx11::string::string((string *)local_568,"",(allocator *)local_928);
  cmake::SetHomeDirectory(&local_818,(string *)local_568);
  std::__cxx11::string::~string((string *)local_568);
  std::__cxx11::string::string((string *)local_568,"",(allocator *)local_928);
  cmake::SetHomeOutputDirectory(&local_818,(string *)local_568);
  std::__cxx11::string::~string((string *)local_568);
  local_558[0]._M_allocated_capacity = local_818.CurrentSnapshot.Position.Position;
  local_568._0_8_ = local_818.CurrentSnapshot.State;
  local_568._8_8_ = local_818.CurrentSnapshot.Position.Tree;
  cmState::Snapshot::SetDefaultDefinitions((Snapshot *)local_568);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)local_568,&local_818);
  this_00 = (cmMakefile *)operator_new(0x730);
  local_928._16_8_ = local_818.CurrentSnapshot.Position.Position;
  local_928._0_8_ = local_818.CurrentSnapshot.State;
  local_928._8_8_ = local_818.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)local_568,(Snapshot *)local_928);
  local_958.x_ = this_00;
  local_930 = cmGlobalGenerator::CreateLocalGenerator((cmGlobalGenerator *)local_568,this_00);
  bVar2 = cmsys::SystemTools::FileExists(settingsFileName);
  if (!bVar2) {
    bVar2 = cmsys::SystemTools::FileExists(fallbackSettingsFileName);
    settingsFileName = fallbackSettingsFileName;
    if (!bVar2) goto LAB_003cd2d9;
  }
  bVar2 = cmMakefile::ReadListFile(local_958.x_,settingsFileName);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Reading GraphViz options file: ");
    poVar3 = std::operator<<(poVar3,settingsFileName);
    std::endl<char,std::char_traits<char>>(poVar3);
    aVar1.x_ = local_958.x_;
    std::__cxx11::string::string((string *)local_928,"GRAPHVIZ_GRAPH_TYPE",(allocator *)&local_950);
    pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)local_928);
    std::__cxx11::string::~string((string *)local_928);
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::assign((char *)this);
    }
    aVar1.x_ = local_958.x_;
    std::__cxx11::string::string((string *)local_928,"GRAPHVIZ_GRAPH_NAME",(allocator *)&local_950);
    pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)local_928);
    std::__cxx11::string::~string((string *)local_928);
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->GraphName);
    }
    aVar1.x_ = local_958.x_;
    std::__cxx11::string::string
              ((string *)local_928,"GRAPHVIZ_GRAPH_HEADER",(allocator *)&local_950);
    pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)local_928);
    std::__cxx11::string::~string((string *)local_928);
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->GraphHeader);
    }
    aVar1.x_ = local_958.x_;
    std::__cxx11::string::string((string *)local_928,"GRAPHVIZ_NODE_PREFIX",(allocator *)&local_950)
    ;
    pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)local_928);
    std::__cxx11::string::~string((string *)local_928);
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->GraphNodePrefix);
    }
    aVar1.x_ = local_958.x_;
    std::__cxx11::string::string((string *)local_928,"GRAPHVIZ_EXECUTABLES",(allocator *)&local_950)
    ;
    pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)local_928);
    std::__cxx11::string::~string((string *)local_928);
    aVar1.x_ = local_958.x_;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)local_928,"GRAPHVIZ_EXECUTABLES",(allocator *)&local_950);
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)local_928);
      this->GenerateForExecutables = bVar2;
      std::__cxx11::string::~string((string *)local_928);
    }
    aVar1.x_ = local_958.x_;
    std::__cxx11::string::string((string *)local_928,"GRAPHVIZ_STATIC_LIBS",(allocator *)&local_950)
    ;
    pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)local_928);
    std::__cxx11::string::~string((string *)local_928);
    aVar1.x_ = local_958.x_;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)local_928,"GRAPHVIZ_STATIC_LIBS",(allocator *)&local_950);
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)local_928);
      this->GenerateForStaticLibs = bVar2;
      std::__cxx11::string::~string((string *)local_928);
    }
    aVar1.x_ = local_958.x_;
    std::__cxx11::string::string((string *)local_928,"GRAPHVIZ_SHARED_LIBS",(allocator *)&local_950)
    ;
    pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)local_928);
    std::__cxx11::string::~string((string *)local_928);
    aVar1.x_ = local_958.x_;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)local_928,"GRAPHVIZ_SHARED_LIBS",(allocator *)&local_950);
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)local_928);
      this->GenerateForSharedLibs = bVar2;
      std::__cxx11::string::~string((string *)local_928);
    }
    aVar1.x_ = local_958.x_;
    std::__cxx11::string::string((string *)local_928,"GRAPHVIZ_MODULE_LIBS",(allocator *)&local_950)
    ;
    pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)local_928);
    std::__cxx11::string::~string((string *)local_928);
    aVar1.x_ = local_958.x_;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)local_928,"GRAPHVIZ_MODULE_LIBS",(allocator *)&local_950);
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)local_928);
      this->GenerateForModuleLibs = bVar2;
      std::__cxx11::string::~string((string *)local_928);
    }
    aVar1.x_ = local_958.x_;
    std::__cxx11::string::string
              ((string *)local_928,"GRAPHVIZ_EXTERNAL_LIBS",(allocator *)&local_950);
    pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)local_928);
    std::__cxx11::string::~string((string *)local_928);
    aVar1.x_ = local_958.x_;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)local_928,"GRAPHVIZ_EXTERNAL_LIBS",(allocator *)&local_950);
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)local_928);
      this->GenerateForExternals = bVar2;
      std::__cxx11::string::~string((string *)local_928);
    }
    aVar1.x_ = local_958.x_;
    std::__cxx11::string::string
              ((string *)local_928,"GRAPHVIZ_GENERATE_PER_TARGET",(allocator *)&local_950);
    pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)local_928);
    std::__cxx11::string::~string((string *)local_928);
    aVar1.x_ = local_958.x_;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)local_928,"GRAPHVIZ_GENERATE_PER_TARGET",(allocator *)&local_950);
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)local_928);
      this->GeneratePerTarget = bVar2;
      std::__cxx11::string::~string((string *)local_928);
    }
    aVar1.x_ = local_958.x_;
    std::__cxx11::string::string
              ((string *)local_928,"GRAPHVIZ_GENERATE_DEPENDERS",(allocator *)&local_950);
    pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)local_928);
    std::__cxx11::string::~string((string *)local_928);
    aVar1.x_ = local_958.x_;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)local_928,"GRAPHVIZ_GENERATE_DEPENDERS",(allocator *)&local_950);
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)local_928);
      this->GenerateDependers = bVar2;
      std::__cxx11::string::~string((string *)local_928);
    }
    aVar1.x_ = local_958.x_;
    local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
    local_950._M_string_length = 0;
    local_950.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string
              ((string *)local_928,"GRAPHVIZ_IGNORE_TARGETS",(allocator *)local_838);
    pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)local_928);
    std::__cxx11::string::~string((string *)local_928);
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&local_950);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    if (local_950._M_string_length != 0) {
      local_858.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_858.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_858.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(&local_950,&local_858,false);
      for (pbVar5 = local_858.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 != local_858.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        std::__cxx11::string::string((string *)local_838,(string *)pbVar5);
        local_870 = (char *)0x0;
        bVar2 = cmsys::RegularExpression::compile((RegularExpression *)local_928,local_838[0]);
        if (!bVar2) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Could not compile bad regex \"");
          poVar3 = std::operator<<(poVar3,(string *)local_838);
          poVar3 = std::operator<<(poVar3,"\"");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                  (&this->TargetsToIgnoreRegex,(RegularExpression *)local_928);
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_928);
        std::__cxx11::string::~string((string *)local_838);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_858);
    }
    std::__cxx11::string::~string((string *)&local_950);
  }
  else {
    cmSystemTools::Error
              ("Problem opening GraphViz options file: ",settingsFileName,(char *)0x0,(char *)0x0);
  }
LAB_003cd2d9:
  if (local_930 != (cmLocalGenerator *)0x0) {
    (*local_930->_vptr_cmLocalGenerator[1])();
  }
  cmsys::auto_ptr<cmMakefile>::~auto_ptr(&local_958);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)local_568);
  cmake::~cmake(&local_818);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(const char* settingsFileName,
                                    const char* fallbackSettingsFileName)
{
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  cmsys::auto_ptr<cmMakefile> mf(
        new cmMakefile(&ggi, cm.GetCurrentSnapshot()));
  cmsys::auto_ptr<cmLocalGenerator> lg(ggi.CreateLocalGenerator(mf.get()));

  const char* inFileName = settingsFileName;

  if ( !cmSystemTools::FileExists(inFileName) )
    {
    inFileName = fallbackSettingsFileName;
    if ( !cmSystemTools::FileExists(inFileName) )
      {
      return;
      }
    }

  if ( !mf->ReadListFile(inFileName) )
    {
    cmSystemTools::Error("Problem opening GraphViz options file: ",
                         inFileName);
    return;
    }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition) \
  { \
  const char* value = mf->GetDefinition(cmakeDefinition); \
  if ( value ) \
    { \
    var = value; \
    } \
  }

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition) \
  { \
  const char* value = mf->GetDefinition(cmakeDefinition); \
  if ( value ) \
    { \
    var = mf->IsOn(cmakeDefinition); \
    } \
  }

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty())
    {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for(std::vector<std::string>::const_iterator itvIt
                                            = ignoreTargetsRegExVector.begin();
        itvIt != ignoreTargetsRegExVector.end();
        ++ itvIt )
      {
      std::string currentRegexString(*itvIt);
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString.c_str()))
        {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
        }
      this->TargetsToIgnoreRegex.push_back(currentRegex);
      }
    }

}